

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O0

void __thiscall
TApp_IniNotRequiredPassedNotFound_Test::TestBody(TApp_IniNotRequiredPassedNotFound_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  AssertHelper local_148;
  Message local_140 [2];
  FileError *anon_var_0;
  char *pcStack_128;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0 [32];
  iterator local_d0;
  size_type local_c8;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30 [8];
  string noini;
  TApp_IniNotRequiredPassedNotFound_Test *this_local;
  
  noini.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"TestIniNotExist.ini",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"--config",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"",&local_b9);
  CLI::App::set_config(&(this->super_TApp).app,&local_68,&local_90,&local_b8,false);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  gtest_msg.value._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_110,"--config",(allocator *)((long)&gtest_msg.value + 7));
  std::__cxx11::string::string(local_f0,local_30);
  gtest_msg.value._6_1_ = 0;
  local_d0 = &local_110;
  local_c8 = 2;
  __l._M_len = 2;
  __l._M_array = local_d0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0;
  do {
    local_190 = local_190 + -1;
    std::__cxx11::string::~string((string *)local_190);
  } while (local_190 != &local_110);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffed8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffed8);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_00119b87;
    pcStack_128 = 
    "Expected: run() throws an exception of type CLI::FileError.\n  Actual: it throws nothing.";
  }
  testing::Message::Message(local_140);
  testing::internal::AssertHelper::AssertHelper
            (&local_148,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
             ,0xfb,pcStack_128);
  testing::internal::AssertHelper::operator=(&local_148,local_140);
  testing::internal::AssertHelper::~AssertHelper(&local_148);
  testing::Message::~Message(local_140);
LAB_00119b87:
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST_F(TApp, IniNotRequiredPassedNotFound) {

    std::string noini = "TestIniNotExist.ini";
    app.set_config("--config", "", "", false);

    args = {"--config", noini};
    EXPECT_THROW(run(), CLI::FileError);
}